

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void * consumer_fun(void *params)

{
  Bucket *this;
  vector<Object_*,_std::allocator<Object_*>_> *__x;
  long lVar1;
  vector<Object_*,_std::allocator<Object_*>_> objs;
  vector<Object_*,_std::allocator<Object_*>_> local_30;
  
  do {
    do {
      this = FastQueue::dequeue(fastqueue);
      __x = Bucket::getObjs(this);
      std::vector<Object_*,_std::allocator<Object_*>_>::vector(&local_30,__x);
      if ((long)local_30.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_30.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar1 = (long)local_30.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_30.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        *(ulong *)params = *params + lVar1 + (ulong)(lVar1 == 0);
      }
      Bucket::releaseBucket(this);
    } while (local_30.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
             super__Vector_impl_data._M_start == (pointer)0x0);
    operator_delete(local_30.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  } while( true );
}

Assistant:

void* consumer_fun(void* params){
    uint64_t* num = (uint64_t*)params;
    int index = 0;
    Bucket* bucket;

    while(true){
       
        bucket = fastqueue->dequeue();
        std::vector<Object*> objs = bucket->getObjs();
        //std::cout<< objs.size() << std::endl;
        for(int i = 0; i < objs.size(); ++i){
            (*num)++;
        }
        bucket->releaseBucket();    
   }
 
   
}